

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O3

void Unr_ManSetup_rec(Unr_Man_t *p,int iObj,int iTent,Vec_Int_t *vRoots)

{
  int *piVar1;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  long lVar8;
  
  if (iObj < 0) {
LAB_005be627:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (p->vTents->nSize <= iObj) goto LAB_005be627;
  piVar1 = p->vTents->pArray;
  if (-1 < piVar1[(uint)iObj]) {
    return;
  }
  piVar1[(uint)iObj] = iTent;
  if (iObj < p->pGia->nObjs) {
    pGVar2 = p->pGia->pObjs;
    uVar7 = *(undefined8 *)(pGVar2 + (uint)iObj);
    if ((~(uint)uVar7 & 0x1fffffff) != 0) {
      uVar6 = (uint)uVar7 & 0x1fffffff;
      Unr_ManSetup_rec(p,iObj - uVar6,iTent,vRoots);
      uVar6 = iObj - uVar6;
      if (((int)uVar6 < 0) || (p->vTents->nSize <= (int)uVar6)) goto LAB_005be627;
      if (p->vRanks->nSize <= (int)uVar6) goto LAB_005be665;
      iVar4 = ~p->vTents->pArray[uVar6] + iTent;
      piVar1 = p->vRanks->pArray;
      iVar5 = piVar1[uVar6];
      if (iVar4 <= iVar5) {
        iVar4 = iVar5;
      }
      iVar5 = 0;
      if (0 < iVar4) {
        iVar5 = iVar4;
      }
      piVar1[uVar6] = iVar5;
      uVar7 = *(undefined8 *)(pGVar2 + (uint)iObj);
      if (-1 < (int)(uint)uVar7 && (~(uint)uVar7 & 0x1fffffff) != 0) {
        uVar6 = (uint)((ulong)uVar7 >> 0x20) & 0x1fffffff;
        Unr_ManSetup_rec(p,iObj - uVar6,iTent,vRoots);
        uVar6 = iObj - uVar6;
        if (((int)uVar6 < 0) || (p->vTents->nSize <= (int)uVar6)) goto LAB_005be627;
        if (p->vRanks->nSize <= (int)uVar6) goto LAB_005be665;
        iVar4 = ~p->vTents->pArray[uVar6] + iTent;
        piVar1 = p->vRanks->pArray;
        iVar5 = piVar1[uVar6];
        if (iVar4 <= iVar5) {
          iVar4 = iVar5;
        }
        iVar5 = 0;
        if (0 < iVar4) {
          iVar5 = iVar4;
        }
        piVar1[uVar6] = iVar5;
        goto LAB_005be611;
      }
    }
    if ((~(uint)uVar7 & 0x9fffffff) == 0) {
      pGVar3 = p->pGia;
      uVar6 = (uint)((ulong)uVar7 >> 0x20) & 0x1fffffff;
      iVar5 = pGVar3->vCis->nSize;
      if (iVar5 - pGVar3->nRegs <= (int)uVar6) {
        iVar4 = pGVar3->vCos->nSize;
        uVar6 = (iVar4 - iVar5) + uVar6;
        if (((int)uVar6 < 0) || (iVar4 <= (int)uVar6)) goto LAB_005be627;
        iVar5 = pGVar3->vCos->pArray[uVar6];
        lVar8 = (long)iVar5;
        if ((lVar8 < 0) || (pGVar3->nObjs <= iVar5)) goto LAB_005be646;
        Vec_IntPush(vRoots,iVar5);
        if (p->vRanks->nSize <= iVar5) {
LAB_005be665:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                        ,0x75,"void Vec_IntWriteMaxEntry(Vec_Int_t *, int, int)");
        }
        piVar1 = p->vRanks->pArray;
        iVar5 = piVar1[lVar8];
        iVar4 = 0;
        if (0 < iVar5) {
          iVar4 = iVar5;
        }
        piVar1[lVar8] = iVar4;
      }
    }
LAB_005be611:
    Vec_IntPush(p->vOrder,iObj);
    return;
  }
LAB_005be646:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Unr_ManSetup_rec( Unr_Man_t * p, int iObj, int iTent, Vec_Int_t * vRoots )
{
    Gia_Obj_t * pObj;
    int iFanin;
    if ( Vec_IntEntry(p->vTents, iObj) >= 0 )
        return;
    Vec_IntWriteEntry(p->vTents, iObj, iTent);
    pObj = Gia_ManObj( p->pGia, iObj );
    if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
    {
        Unr_ManSetup_rec( p, (iFanin = Gia_ObjFaninId0(pObj, iObj)), iTent, vRoots );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, Abc_MaxInt(0, iTent - Vec_IntEntry(p->vTents, iFanin) - 1) );
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Unr_ManSetup_rec( p, (iFanin = Gia_ObjFaninId1(pObj, iObj)), iTent, vRoots );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, Abc_MaxInt(0, iTent - Vec_IntEntry(p->vTents, iFanin) - 1) );
    }
    else if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        Vec_IntPush( vRoots, (iFanin = Gia_ObjId(p->pGia, Gia_ObjRoToRi(p->pGia, pObj))) );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, 0 );
    }
    Vec_IntPush( p->vOrder, iObj );
}